

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeUMinInst
          (GraphicsRobustAccessPass *this,TypeManager *tm,Instruction *x,Instruction *y,
          Instruction *where)

{
  array<signed_char,_4UL> aVar1;
  uint32_t result_id;
  uint32_t uVar2;
  int iVar3;
  uint32_t id;
  int iVar4;
  array<signed_char,_4UL> aVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pOVar7;
  Instruction *pIVar8;
  pointer *__ptr;
  long lVar9;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  Operand *__cur;
  pointer *__ptr_1;
  SmallVector<unsigned_int,_2UL> *this_01;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_1a8;
  undefined1 local_190 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_170;
  undefined1 local_168 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_148;
  undefined1 local_140 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_120;
  undefined1 local_118 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f8;
  undefined4 local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  undefined4 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  aVar1._M_elems = (_Type)GetGlslInsts(this);
  result_id = Pass::TakeNextId(&this->super_Pass);
  id = 0;
  uVar2 = 0;
  if (x->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(x,0);
  }
  pTVar6 = analysis::TypeManager::GetType(tm,uVar2);
  iVar3 = (*pTVar6->_vptr_Type[9])(pTVar6);
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0x24);
  if (y->has_type_id_ == true) {
    id = Instruction::GetSingleWordOperand(y,0);
  }
  pTVar6 = analysis::TypeManager::GetType(tm,id);
  iVar4 = (*pTVar6->_vptr_Type[9])(pTVar6);
  if (iVar3 == *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24)) {
    aVar5._M_elems[0] = '\0';
    aVar5._M_elems[1] = '\0';
    aVar5._M_elems[2] = '\0';
    aVar5._M_elems[3] = '\0';
    uVar2 = 0;
    if (x->has_type_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(x,0);
    }
    local_118._24_8_ = local_118 + 0x10;
    local_118._0_8_ = &PTR__SmallVector_003e9b28;
    local_f8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_118._8_8_ = 1;
    this_01 = &local_e8;
    local_f0 = 1;
    local_e8._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    local_e8.size_ = 0;
    local_e8.small_data_ = (uint *)local_e8.buffer;
    local_e8.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_118._16_4_ = aVar1._M_elems;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (this_01,(SmallVector<unsigned_int,_2UL> *)local_118);
    local_140._24_8_ = local_140 + 0x10;
    local_140._0_8_ = &PTR__SmallVector_003e9b28;
    local_120._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_140[0x10] = '&';
    local_140[0x11] = '\0';
    local_140[0x12] = '\0';
    local_140[0x13] = '\0';
    local_140._8_8_ = 1;
    local_c0 = 7;
    local_b8._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    local_b8.size_ = 0;
    local_b8.small_data_ = (uint *)local_b8.buffer;
    local_b8.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_b8,(SmallVector<unsigned_int,_2UL> *)local_140);
    if (x->has_result_id_ == true) {
      aVar5._M_elems = (_Type)Instruction::GetSingleWordOperand(x,(uint)x->has_type_id_);
    }
    local_168._24_8_ = local_168 + 0x10;
    local_168._0_8_ = &PTR__SmallVector_003e9b28;
    aVar1._M_elems[0] = '\0';
    aVar1._M_elems[1] = '\0';
    aVar1._M_elems[2] = '\0';
    aVar1._M_elems[3] = '\0';
    local_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_168._8_8_ = 1;
    local_90 = 1;
    local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    local_88.size_ = 0;
    local_88.small_data_ = (uint *)local_88.buffer;
    local_88.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_168._16_4_ = aVar5._M_elems;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_88,(SmallVector<unsigned_int,_2UL> *)local_168);
    if (y->has_result_id_ == true) {
      aVar1._M_elems = (_Type)Instruction::GetSingleWordOperand(y,(uint)y->has_type_id_);
    }
    local_190._24_8_ = local_190 + 0x10;
    local_190._0_8_ = &PTR__SmallVector_003e9b28;
    local_170._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_190._8_8_ = 1;
    local_60 = 1;
    local_58._0_8_ = &PTR__SmallVector_003e9b28;
    local_58._8_8_ = 0;
    local_58._24_8_ = local_58 + 0x10;
    local_38._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_190._16_4_ = aVar1._M_elems;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_58,
               (SmallVector<unsigned_int,_2UL> *)local_190);
    local_1a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar9 = 0xc0;
    pOVar7 = (pointer)operator_new(0xc0);
    local_1a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar7 + 4;
    local_1a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = pOVar7;
    do {
      pOVar7->type = *(spv_operand_type_t *)
                      &this_01[-1].large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      (pOVar7->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
      (pOVar7->words).size_ = 0;
      (pOVar7->words).small_data_ = (uint *)(pOVar7->words).buffer;
      (pOVar7->words).large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar7->words,this_01);
      pOVar7 = pOVar7 + 1;
      this_01 = (SmallVector<unsigned_int,_2UL> *)&this_01[1].size_;
      lVar9 = lVar9 + -0x30;
    } while (lVar9 != 0);
    local_1a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = pOVar7;
    pIVar8 = InsertInst(this,where,OpExtInst,uVar2,result_id,&local_1a8);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&local_1a8);
    lVar9 = -0xc0;
    this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38
    ;
    do {
      *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
      }
      *(undefined8 *)this_00 = 0;
      this_00 = this_00 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    local_190._0_8_ = &PTR__SmallVector_003e9b28;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_170._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_170,local_170._M_head_impl);
    }
    local_168._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_148._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_148,local_148._M_head_impl);
    }
    local_140._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_120._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_120,local_120._M_head_impl);
    }
    local_118._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_f8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_f8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_f8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    return pIVar8;
  }
  __assert_fail("xwidth == ywidth",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x26e,
                "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeUMinInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *)"
               );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeUMinInst(
    const analysis::TypeManager& tm, Instruction* x, Instruction* y,
    Instruction* where) {
  // Get IDs of instructions we'll be referencing. Evaluate them before calling
  // the function so we force a deterministic ordering in case both of them need
  // to take a new ID.
  const uint32_t glsl_insts_id = GetGlslInsts();
  uint32_t smin_id = TakeNextId();
  const auto xwidth = tm.GetType(x->type_id())->AsInteger()->width();
  const auto ywidth = tm.GetType(y->type_id())->AsInteger()->width();
  assert(xwidth == ywidth);
  (void)xwidth;
  (void)ywidth;
  auto* smin_inst = InsertInst(
      where, spv::Op::OpExtInst, x->type_id(), smin_id,
      {
          {SPV_OPERAND_TYPE_ID, {glsl_insts_id}},
          {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {GLSLstd450UMin}},
          {SPV_OPERAND_TYPE_ID, {x->result_id()}},
          {SPV_OPERAND_TYPE_ID, {y->result_id()}},
      });
  return smin_inst;
}